

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

RangeValue __thiscall CoreML::RangeValue::operator-(RangeValue *this,int other)

{
  undefined8 extraout_RAX;
  ulong uVar1;
  undefined8 extraout_RAX_00;
  RangeValue RVar2;
  RangeValue retval;
  RangeValue local_30;
  RangeValue local_20;
  
  RangeValue(&local_20);
  if (this->_isUnbound == true) {
    uVar1 = CONCAT71((int7)((ulong)extraout_RAX >> 8),local_20._isUnbound);
  }
  else if (other < 0) {
    RangeValue(&local_30);
    if (this->_isUnbound == false) {
      uVar1 = 0;
      local_20._val = (ulong)(uint)-other + this->_val;
    }
    else {
      uVar1 = (ulong)(uint)local_30._0_4_;
      local_20._val = local_30._val;
    }
  }
  else {
    RangeValue(&local_30);
    if (this->_isUnbound == true) {
      uVar1 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_30._isUnbound);
      local_20._val = local_30._val;
    }
    else {
      uVar1 = 0;
      local_20._val = 0;
      if ((ulong)(uint)other <= this->_val) {
        local_20._val = this->_val - (ulong)(uint)other;
      }
    }
  }
  RVar2._val = local_20._val;
  RVar2._0_8_ = uVar1;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator- (int other) const {
    RangeValue retval;
    if (_isUnbound)
        return retval;
    else if (other < 0) {
        return (*this) + static_cast<size_t>(-1*other);
    }
    else
        return (*this) - static_cast<size_t>(other);
}